

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::remap_raytracing_pipeline_ci
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *info)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  VkPipeline *out_pipeline;
  
  bVar1 = remap_shader_module_handles<VkRayTracingPipelineCreateInfoKHR>(this,info);
  if ((!bVar1) ||
     (((info->basePipelineHandle != (VkPipeline)0x0 &&
       (bVar1 = remap_raytracing_pipeline_handle
                          (this,info->basePipelineHandle,&info->basePipelineHandle), !bVar1)) ||
      (bVar1 = remap_pipeline_layout_handle(this,info->layout,&info->layout), !bVar1)))) {
    return false;
  }
  if ((info->pLibraryInfo != (VkPipelineLibraryCreateInfoKHR *)0x0) &&
     (bVar1 = info->pLibraryInfo->libraryCount != 0, bVar1)) {
    out_pipeline = info->pLibraryInfo->pLibraries;
    bVar2 = remap_raytracing_pipeline_handle(this,*out_pipeline,out_pipeline);
    if (bVar2) {
      uVar3 = 1;
      do {
        out_pipeline = out_pipeline + 1;
        bVar1 = uVar3 < info->pLibraryInfo->libraryCount;
        if (!bVar1) {
          return true;
        }
        bVar2 = remap_raytracing_pipeline_handle(this,*out_pipeline,out_pipeline);
        uVar3 = uVar3 + 1;
      } while (bVar2);
    }
    if (bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool StateRecorder::Impl::remap_raytracing_pipeline_ci(VkRayTracingPipelineCreateInfoKHR *info)
{
	if (!remap_shader_module_handles(info))
		return false;

	if (info->basePipelineHandle != VK_NULL_HANDLE)
		if (!remap_raytracing_pipeline_handle(info->basePipelineHandle, &info->basePipelineHandle))
			return false;

	if (!remap_pipeline_layout_handle(info->layout, &info->layout))
		return false;

	if (info->pLibraryInfo)
	{
		auto *libraries = const_cast<VkPipeline *>(info->pLibraryInfo->pLibraries);
		for (uint32_t i = 0; i < info->pLibraryInfo->libraryCount; i++)
		{
			if (!remap_raytracing_pipeline_handle(libraries[i], &libraries[i]))
				return false;
		}
	}

	return true;
}